

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

pair<unsigned_long,_unsigned_long>
httplib::detail::get_range_offset_and_length(Request *req,size_t content_length,size_t index)

{
  const_reference pvVar1;
  long *plVar2;
  pair<int,_unsigned_long> pVar3;
  unsigned_long local_88;
  pair<long,_unsigned_long> local_80;
  long local_70 [3];
  ssize_t slen;
  pair<int,_unsigned_long> local_50;
  long local_40;
  value_type r;
  size_t index_local;
  size_t content_length_local;
  Request *req_local;
  
  r.second = index;
  index_local = content_length;
  content_length_local = (size_t)req;
  pvVar1 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::operator[]
                     (&req->ranges,index);
  local_40 = pvVar1->first;
  r.first = pvVar1->second;
  if ((local_40 == -1) && (r.first == -1)) {
    slen._4_4_ = 0;
    pVar3 = std::make_pair<int,unsigned_long&>((int *)((long)&slen + 4),&index_local);
    local_50.second = pVar3.second;
    local_50.first = pVar3.first;
    std::pair<unsigned_long,_unsigned_long>::pair<int,_unsigned_long,_true>
              ((pair<unsigned_long,_unsigned_long> *)&req_local,&local_50);
  }
  else {
    local_70[2] = index_local;
    if (local_40 == -1) {
      local_70[1] = 0;
      local_70[0] = index_local - r.first;
      plVar2 = std::max<long>(local_70 + 1,local_70);
      local_40 = *plVar2;
      r.first = local_70[2] - 1;
    }
    if (r.first == -1) {
      r.first = local_70[2] - 1;
    }
    local_88 = (r.first - local_40) + 1;
    local_80 = std::make_pair<long&,unsigned_long>(&local_40,&local_88);
    std::pair<unsigned_long,_unsigned_long>::pair<long,_unsigned_long,_true>
              ((pair<unsigned_long,_unsigned_long> *)&req_local,&local_80);
  }
  return _req_local;
}

Assistant:

inline std::pair<size_t, size_t>
get_range_offset_and_length(const Request &req, size_t content_length,
                            size_t index) {
  auto r = req.ranges[index];

  if (r.first == -1 && r.second == -1) {
    return std::make_pair(0, content_length);
  }

  auto slen = static_cast<ssize_t>(content_length);

  if (r.first == -1) {
    r.first = (std::max)(static_cast<ssize_t>(0), slen - r.second);
    r.second = slen - 1;
  }

  if (r.second == -1) { r.second = slen - 1; }
  return std::make_pair(r.first, static_cast<size_t>(r.second - r.first) + 1);
}